

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EDCircles.cpp
# Opt level: O3

void __thiscall EDCircles::JoinArcs2(EDCircles *this)

{
  int *piVar1;
  MyArc *__src;
  int iVar2;
  int ey;
  MyArc *pMVar3;
  BufferManager *pBVar4;
  EDArcs *pEVar5;
  Circle *pCVar6;
  bool bVar7;
  int iVar8;
  void *__s;
  void *pvVar9;
  bool bVar10;
  size_t sVar11;
  long lVar12;
  undefined8 *puVar13;
  size_t sVar14;
  ulong uVar15;
  uint N;
  int iVar16;
  uint noPoints;
  ulong uVar17;
  size_t sVar18;
  double *x;
  double *y;
  size_t __n;
  uint *puVar19;
  bool bVar20;
  double dVar21;
  double dVar23;
  undefined1 auVar22 [16];
  double dVar24;
  double dVar25;
  int local_237c;
  int local_2370;
  int local_236c;
  double local_2308;
  double local_22f8;
  double R;
  double YC;
  double XC;
  undefined8 local_22d8;
  undefined8 uStack_22d0;
  undefined8 local_22c8;
  undefined8 uStack_22c0;
  uint *local_22b0;
  size_t local_22a8;
  ulong local_22a0;
  long local_2298;
  ulong local_2290;
  double CircleFitError;
  double eTheta;
  EllipseEquation eq;
  EllipseEquation Eq;
  AngleSet local_2200;
  
  sortArc(this->edarcs2->arcs,this->edarcs2->noArcs);
  iVar2 = this->edarcs2->noArcs;
  __n = (size_t)iVar2;
  pMVar3 = this->edarcs2->arcs;
  sVar18 = __n;
  if ((long)__n < 0) {
    sVar18 = 0xffffffffffffffff;
  }
  __s = operator_new__(sVar18);
  if ((long)__n < 1) {
    uVar17 = __n << 4;
    if (iVar2 < 0) {
      uVar17 = 0xffffffffffffffff;
    }
    pvVar9 = operator_new__(uVar17);
  }
  else {
    memset(__s,0,__n);
    pvVar9 = operator_new__(__n << 4);
    local_22b0 = (uint *)((long)pvVar9 + 4);
    sVar18 = 1;
    sVar11 = 0;
    do {
      if (*(char *)((long)__s + sVar11) != '\x01') {
        Eq.coeff[4] = 0.0;
        Eq.coeff[5] = 0.0;
        Eq.coeff[2] = 0.0;
        Eq.coeff[3] = 0.0;
        Eq.coeff[0] = 0.0;
        Eq.coeff[1] = 0.0;
        Eq.coeff[6] = 0.0;
        __src = pMVar3 + sVar11;
        local_2308 = pMVar3[sVar11].r;
        local_237c = pMVar3[sVar11].turn;
        uVar17 = (ulong)pMVar3[sVar11].noPixels;
        local_2370 = pMVar3[sVar11].sx;
        iVar2 = pMVar3[sVar11].sy;
        local_236c = pMVar3[sVar11].ex;
        pBVar4 = this->bm;
        x = pBVar4->x + pBVar4->index;
        y = pBVar4->y + pBVar4->index;
        ey = pMVar3[sVar11].ey;
        memcpy(x,pMVar3[sVar11].x,uVar17 << 3);
        memcpy(y,pMVar3[sVar11].y,uVar17 << 3);
        local_2200.head = -1;
        local_2200.next = 0;
        local_2200.overlapAmount = 0.0;
        AngleSet::set(&local_2200,pMVar3[sVar11].sTheta,pMVar3[sVar11].eTheta);
        bVar10 = true;
        local_22a8 = sVar11;
        do {
          N = (uint)uVar17;
          if ((long)__n <= (long)(sVar11 + 1)) {
LAB_0010f4c1:
            if (bVar10) {
              pEVar5 = this->edarcs3;
              iVar2 = pEVar5->noArcs;
              pEVar5->noArcs = iVar2 + 1;
              memcpy(pEVar5->arcs + iVar2,__src,0xa8);
              goto LAB_0010f74f;
            }
            break;
          }
          local_22c8 = (double *)CONCAT44(local_2370,local_2370);
          uStack_22c0 = 0;
          local_22d8 = (double *)CONCAT44(iVar2,iVar2);
          uStack_22d0 = 0;
          uVar17 = 0;
          sVar14 = sVar18;
          do {
            if (((*(char *)((long)__s + sVar14) == '\0') &&
                (pMVar3[sVar14].segmentNo == __src->segmentNo)) &&
               (pMVar3[sVar14].turn == local_237c)) {
              dVar21 = pMVar3[sVar14].r;
              dVar23 = dVar21;
              if (local_2308 <= dVar21) {
                dVar23 = local_2308;
              }
              if ((ABS(local_2308 - dVar21) <= dVar23 * 2.5) &&
                 (dVar21 = AngleSet::overlap(&local_2200,pMVar3[sVar14].sTheta,pMVar3[sVar14].eTheta
                                            ), dVar21 < 0.75)) {
                dVar21 = (double)((int)local_22c8 - pMVar3[sVar14].ex);
                dVar23 = (double)(local_22c8._4_4_ - pMVar3[sVar14].sx);
                dVar24 = (double)((int)local_22d8 - pMVar3[sVar14].ey);
                dVar25 = (double)(local_22d8._4_4_ - pMVar3[sVar14].sy);
                auVar22._0_8_ = dVar21 * dVar21 + dVar24 * dVar24;
                auVar22._8_8_ = dVar23 * dVar23 + dVar25 * dVar25;
                auVar22 = sqrtpd(auVar22,auVar22);
                dVar23 = auVar22._0_8_;
                dVar24 = auVar22._8_8_;
                dVar21 = dVar23;
                if (dVar24 <= dVar23) {
                  dVar21 = dVar24;
                }
                iVar8 = (dVar23 < dVar24) + 1;
                dVar23 = (double)(local_236c - pMVar3[sVar14].sx);
                dVar24 = (double)(ey - pMVar3[sVar14].sy);
                dVar23 = SQRT(dVar23 * dVar23 + dVar24 * dVar24);
                if (dVar23 < dVar21) {
                  iVar8 = 3;
                  dVar21 = dVar23;
                }
                dVar23 = (double)(local_236c - pMVar3[sVar14].ex);
                dVar24 = (double)(ey - pMVar3[sVar14].ey);
                dVar23 = SQRT(dVar23 * dVar23 + dVar24 * dVar24);
                if (dVar23 < dVar21) {
                  iVar8 = 4;
                  dVar21 = dVar23;
                }
                if (dVar21 <= 5.0) {
                  iVar16 = (int)uVar17;
                  if (0 < iVar16) {
                    puVar13 = (undefined8 *)(uVar17 * 0x10 + (long)pvVar9);
                    do {
                      if ((double)puVar13[-1] <= dVar21 && dVar21 != (double)puVar13[-1])
                      goto LAB_0010f1d6;
                      *puVar13 = puVar13[-2];
                      puVar13[1] = puVar13[-1];
                      bVar20 = 1 < uVar17;
                      uVar17 = uVar17 - 1;
                      puVar13 = puVar13 + -2;
                    } while (bVar20);
                    uVar17 = 0;
                  }
LAB_0010f1d6:
                  lVar12 = (long)(int)uVar17 * 0x10;
                  *(int *)((long)pvVar9 + lVar12) = (int)sVar14;
                  *(int *)((long)pvVar9 + lVar12 + 4) = iVar8;
                  *(double *)((long)pvVar9 + lVar12 + 8) = dVar21;
                  uVar17 = (ulong)(iVar16 + 1);
                }
              }
            }
            sVar14 = sVar14 + 1;
          } while (sVar14 != __n);
          if ((int)uVar17 < 1) goto LAB_0010f4c1;
          local_22c8 = x + (int)N;
          local_22d8 = y + (int)N;
          local_2298 = -uVar17;
          bVar20 = true;
          uVar15 = 1;
          puVar19 = local_22b0;
          local_2290 = uVar17;
          while( true ) {
            lVar12 = (long)(int)puVar19[-1];
            local_22a0 = (ulong)*puVar19;
            memcpy(local_22c8,pMVar3[lVar12].x,(long)pMVar3[lVar12].noPixels << 3);
            memcpy(local_22d8,pMVar3[lVar12].y,(long)pMVar3[lVar12].noPixels << 3);
            noPoints = pMVar3[lVar12].noPixels + N;
            uVar17 = (ulong)noPoints;
            eq.coeff[4] = 0.0;
            eq.coeff[5] = 0.0;
            eq.coeff[2] = 0.0;
            eq.coeff[3] = 0.0;
            eq.coeff[0] = 0.0;
            eq.coeff[1] = 0.0;
            eq.coeff[6] = 0.0;
            bVar7 = EllipseFit(x,y,noPoints,&eq,1);
            if ((bVar7) && (dVar21 = ComputeEllipseError(&eq,x,y,noPoints), dVar21 <= 1.5)) break;
            bVar20 = uVar15 < local_2290;
            puVar19 = puVar19 + 4;
            lVar12 = local_2298 + uVar15;
            uVar15 = uVar15 + 1;
            if (lVar12 == 0) goto LAB_0010f4c1;
          }
          Eq.coeff[6] = eq.coeff[6];
          Eq.coeff[4] = eq.coeff[4];
          Eq.coeff[5] = eq.coeff[5];
          Eq.coeff[2] = eq.coeff[2];
          Eq.coeff[3] = eq.coeff[3];
          Eq.coeff[0] = eq.coeff[0];
          Eq.coeff[1] = eq.coeff[1];
          *(undefined1 *)((long)__s + lVar12) = 1;
          *(undefined1 *)((long)__s + local_22a8) = 1;
          local_2308 = (local_2308 + pMVar3[lVar12].r) * 0.5;
          AngleSet::set(&local_2200,pMVar3[lVar12].sTheta,pMVar3[lVar12].eTheta);
          switch((int)local_22a0) {
          case 1:
            iVar16 = pMVar3[lVar12].ex;
            iVar8 = pMVar3[lVar12].ey;
            goto LAB_0010f466;
          case 2:
            iVar16 = pMVar3[lVar12].sx;
            iVar8 = pMVar3[lVar12].sy;
LAB_0010f466:
            local_237c = ((local_237c != 1) - 1) + (uint)(local_237c != 1);
            local_2370 = local_236c;
            iVar2 = ey;
            ey = iVar8;
            local_236c = iVar16;
            break;
          case 3:
            local_236c = pMVar3[lVar12].ex;
            ey = pMVar3[lVar12].ey;
            break;
          case 4:
            local_236c = pMVar3[lVar12].sx;
            ey = pMVar3[lVar12].sy;
          }
          bVar10 = false;
          local_22f8 = dVar21;
          N = noPoints;
        } while (bVar20);
        AngleSet::computeStartEndTheta(&local_2200,eq.coeff,&eTheta);
        CircleFit(x,y,N,&XC,&YC,&R,&CircleFitError);
        if ((((double)(-(ulong)(eq.coeff[0] < eTheta) & (ulong)-eq.coeff[0] |
                      ~-(ulong)(eq.coeff[0] < eTheta) & (ulong)(6.283185307179586 - eq.coeff[0])) +
             eTheta) / 6.283185307179586 < 0.67) || (1.5 < CircleFitError)) {
          addArc(this->edarcs3->arcs,&this->edarcs3->noArcs,XC,YC,R,CircleFitError,eq.coeff[0],
                 eTheta,local_237c,__src->segmentNo,&Eq,local_22f8,local_2370,iVar2,local_236c,ey,x,
                 y,N,local_2200.overlapAmount / 6.283185307179586);
        }
        else {
          pCVar6 = this->circles1;
          iVar2 = this->noCircles1;
          pCVar6[iVar2].xc = XC;
          pCVar6[iVar2].yc = YC;
          pCVar6[iVar2].r = R;
          pCVar6[iVar2].circleFitError = CircleFitError;
          pCVar6[iVar2].coverRatio = (double)(int)N / (R * 6.283185307179586);
          pCVar6[iVar2].x = x;
          pCVar6[iVar2].y = y;
          pCVar6[iVar2].noPixels = N;
          iVar2 = this->noCircles1;
          pCVar6[iVar2].isEllipse = false;
          this->noCircles1 = iVar2 + 1;
        }
        piVar1 = &this->bm->index;
        *piVar1 = *piVar1 + N;
      }
LAB_0010f74f:
      sVar11 = sVar11 + 1;
      sVar18 = sVar18 + 1;
    } while (sVar11 != __n);
  }
  operator_delete__(__s);
  operator_delete__(pvVar9);
  return;
}

Assistant:

void EDCircles::JoinArcs2()
{
	AngleSet angles;

	// Sort the arcs with respect to their length so that longer arcs are at the beginning
	sortArc(edarcs2->arcs, edarcs2->noArcs);

	int noArcs = edarcs2->noArcs;
	MyArc *arcs = edarcs2->arcs;

	bool *taken = new bool[noArcs];
	for (int i = 0; i<noArcs; i++) taken[i] = false;

	struct CandidateArc {
		int arcNo;
		int which;    // 1: (SX, SY)-(sx, sy), 2: (SX, SY)-(ex, ey), 3: (EX, EY)-(sx, sy), 4: (EX, EY)-(ex, ey)
		double dist;  // min distance between the end points
	};

	CandidateArc *candidateArcs = new CandidateArc[noArcs];
	int noCandidateArcs;

	for (int i = 0; i<noArcs; i++) {
		if (taken[i]) continue;

		// Current arc
		bool EllipseEqValid = false;
		EllipseEquation Eq;
		double EllipseFitError;

		double R = arcs[i].r;
		int Turn = arcs[i].turn;
		int NoPixels = arcs[i].noPixels;

		int SX = arcs[i].sx;
		int SY = arcs[i].sy;
		int EX = arcs[i].ex;
		int EY = arcs[i].ey;

		// Take the pixels making up this arc
		int noPixels = arcs[i].noPixels;

		double *x = bm->getX();
		double *y = bm->getY();
		memcpy(x, arcs[i].x, noPixels * sizeof(double));
		memcpy(y, arcs[i].y, noPixels * sizeof(double));

		angles.clear();
		angles.set(arcs[i].sTheta, arcs[i].eTheta);

		while (1) {
			bool extendedArc = false;

			// Find other arcs to join with
			noCandidateArcs = 0;

			for (int j = i + 1; j<noArcs; j++) {
				if (taken[j]) continue;
				if (arcs[j].segmentNo != arcs[i].segmentNo) continue;
				if (arcs[j].turn != Turn) continue;

				double minR = MIN(R, arcs[j].r);
				double radiusDiffThreshold = minR*2.5;

				double diff = fabs(R - arcs[j].r);
				if (diff > radiusDiffThreshold) continue;

				// If 75% of the current arc overlaps with the existing arc, then ignore this arc
				if (angles.overlap(arcs[j].sTheta, arcs[j].eTheta) >= 0.75) continue;

				// Compute the distances
				// 1: (SX, SY)-(sx, sy)
				double dx = SX - arcs[j].sx;
				double dy = SY - arcs[j].sy;
				double d = sqrt(dx*dx + dy*dy);
				int which = 1;

				// 2: (SX, SY)-(ex, ey)
				dx = SX - arcs[j].ex;
				dy = SY - arcs[j].ey;
				double d2 = sqrt(dx*dx + dy*dy);
				if (d2 < d) { d = d2; which = 2; }

				// 3: (EX, EY)-(sx, sy)
				dx = EX - arcs[j].sx;
				dy = EY - arcs[j].sy;
				d2 = sqrt(dx*dx + dy*dy);
				if (d2 < d) { d = d2; which = 3; }

				// 4: (EX, EY)-(ex, ey)
				dx = EX - arcs[j].ex;
				dy = EY - arcs[j].ey;
				d2 = sqrt(dx*dx + dy*dy);
				if (d2 < d) { d = d2; which = 4; }

				// Endpoints must be very close
				double maxDistanceBetweenEndpoints = 5; //10; 
				if (d > maxDistanceBetweenEndpoints) continue;

				// Add to candidate arcs in sorted order. User insertion sort
				int index = noCandidateArcs - 1;
				while (index >= 0) {
					if (candidateArcs[index].dist < d) break;

					candidateArcs[index + 1] = candidateArcs[index];
					index--;
				} //end-while

				  // Add the new candidate arc to the candidate list
				index++;
				candidateArcs[index].arcNo = j;
				candidateArcs[index].which = which;
				candidateArcs[index].dist = d;
				noCandidateArcs++;
			} //end-for

			  // Try to join the current arc with the candidate arc (if there is one)
			if (noCandidateArcs > 0) {
				for (int j = 0; j<noCandidateArcs; j++) {
					int CandidateArcNo = candidateArcs[j].arcNo;
					int Which = candidateArcs[j].which;

					int noPixelsSave = noPixels;
					memcpy(x + noPixels, arcs[CandidateArcNo].x, arcs[CandidateArcNo].noPixels * sizeof(double));
					memcpy(y + noPixels, arcs[CandidateArcNo].y, arcs[CandidateArcNo].noPixels * sizeof(double));
					noPixels += arcs[CandidateArcNo].noPixels;

					// Directly fit an ellipse
					EllipseEquation eq;
					double ellipseFitError = 1e10;
					if (EllipseFit(x, y, noPixels, &eq)) ellipseFitError = ComputeEllipseError(&eq, x, y, noPixels);

					if (ellipseFitError > ELLIPSE_ERROR) {
						// No match. Continue with the next candidate
						noPixels = noPixelsSave;

					}
					else {
						// Match. Take it
						extendedArc = true;
						EllipseEqValid = true;
						Eq = eq;
						EllipseFitError = ellipseFitError;
						NoPixels = noPixels;

						taken[CandidateArcNo] = true;
						taken[i] = true;

						R = (R + arcs[CandidateArcNo].r) / 2.0;

						angles.set(arcs[CandidateArcNo].sTheta, arcs[CandidateArcNo].eTheta);

						// Update the end points of the new arc
						switch (Which) {
							// (SX, SY)-(sy, sy)
						case 1: SX = EX, SY = EY; EX = arcs[CandidateArcNo].ex; EY = arcs[CandidateArcNo].ey;
							if (Turn == 1) Turn = -1; else Turn = 1; // reverse the turn direction
							break;

							// (SX, SY)-(ex, ey)
						case 2: SX = EX, SY = EY; EX = arcs[CandidateArcNo].sx; EY = arcs[CandidateArcNo].sy;
							if (Turn == 1) Turn = -1; else Turn = 1; // reverse the turn direction
							break;

							// (EX, EY)-(sx, sy)
						case 3: EX = arcs[CandidateArcNo].ex; EY = arcs[CandidateArcNo].ey; break;

							// (EX, EY)-(ex, ey)
						case 4: EX = arcs[CandidateArcNo].sx; EY = arcs[CandidateArcNo].sy; break;
						} //end-switch

						break; // Do not look at the other candidates
					} //end-if
				} //end-for
			} //end-if

			if (extendedArc == false) break;
		} //end-while

		if (EllipseEqValid == false) {
			// Add to arcs
			edarcs3->arcs[edarcs3->noArcs++] = arcs[i];

		}
		else {
			// Add the current OR the extended arc to the new arcs
			double sTheta, eTheta;
			angles.computeStartEndTheta(sTheta, eTheta);

			double XC, YC, R, CircleFitError;
			CircleFit(x, y, NoPixels, &XC, &YC, &R, &CircleFitError);

			double coverage = ArcLength(sTheta, eTheta) / TWOPI;
			if ((coverage >= FULL_CIRCLE_RATIO && CircleFitError <= LONG_ARC_ERROR))
				addCircle(circles1, noCircles1, XC, YC, R, CircleFitError, x, y, NoPixels);
			else
				addArc(edarcs3->arcs, edarcs3->noArcs, XC, YC, R, CircleFitError, sTheta, eTheta, Turn, arcs[i].segmentNo, &Eq, EllipseFitError, SX, SY, EX, EY, x, y, NoPixels, angles.overlapRatio());

			// Move buffer pointers
			bm->move(NoPixels);
		} //end-if
	} //end-for

	delete[] taken;
	delete[] candidateArcs;
}